

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.h
# Opt level: O0

void set_blk_skip(uint8_t *txb_skip,int plane,int blk_idx,int skip)

{
  int skip_local;
  int blk_idx_local;
  int plane_local;
  uint8_t *txb_skip_local;
  
  if (skip == 0) {
    txb_skip[blk_idx] = txb_skip[blk_idx] & ((byte)(1L << ((byte)plane & 0x3f)) ^ 0xff);
  }
  else {
    txb_skip[blk_idx] = txb_skip[blk_idx] | (byte)(1L << ((byte)plane & 0x3f));
  }
  return;
}

Assistant:

static inline void set_blk_skip(uint8_t txb_skip[], int plane, int blk_idx,
                                int skip) {
  if (skip)
    txb_skip[blk_idx] |= 1UL << plane;
  else
    txb_skip[blk_idx] &= ~(1UL << plane);
#ifndef NDEBUG
  // Set chroma planes to uninitialized states when luma is set to check if
  // it will be set later
  if (plane == 0) {
    txb_skip[blk_idx] |= 1UL << (1 + 4);
    txb_skip[blk_idx] |= 1UL << (2 + 4);
  }

  // Clear the initialization checking bit
  txb_skip[blk_idx] &= ~(1UL << (plane + 4));
#endif
}